

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result
btree_init_and_load(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
                   uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta,
                   uint64_t num_keys,btree_load_get_next_kv *next_kv,
                   btree_load_write_done *write_done,void *aux)

{
  uint8_t *puVar1;
  undefined2 uVar2;
  code *pcVar3;
  undefined8 uVar4;
  bid_t bVar5;
  void *pvVar6;
  int __c;
  bid_t bVar7;
  uint64_t uVar8;
  bid_t *__s;
  uint8_t *puVar9;
  uint64_t uVar10;
  bnode *pbVar11;
  size_t sVar12;
  uint8_t auStackY_100 [8];
  undefined8 uStackY_f8;
  bnode **local_f0;
  ulong local_e8;
  bid_t enc_bid;
  void *val_to_insert_1;
  void *key_to_insert_1;
  void *new_addr;
  bid_t new_bid;
  size_t jj;
  uint64_t ii_1;
  uint8_t *k_in_child;
  bid_t *node_bids;
  bnode **cur_node;
  uint64_t max_accomm_entries;
  size_t exp_height;
  void *val_to_insert;
  void *key_to_insert;
  uint64_t ii;
  bnode *root_node;
  size_t subblock_size;
  size_t required_size;
  size_t max_num_entries_root;
  size_t max_num_entries_non_root;
  size_t min_nodesize;
  void *addr;
  uint8_t ksize_local;
  btree_kv_ops *pbStack_30;
  uint32_t nodesize_local;
  btree_kv_ops *kv_ops_local;
  btree_blk_ops *blk_ops_local;
  void *blk_handle_local;
  btree *btree_local;
  
  btree->root_flag = flag | 1;
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->height = 1;
  btree->blksize = nodesize;
  btree->ksize = ksize;
  btree->vsize = vsize;
  if (meta == (btree_meta *)0x0) {
    max_num_entries_non_root = 0x11;
  }
  else {
    btree->root_flag = btree->root_flag | 2;
    max_num_entries_non_root = ((ulong)meta->size + 0x11 & 0xfffffffffffffff0) + 0x11;
  }
  if (btree->blksize < max_num_entries_non_root) {
    btree_local._4_4_ = BTREE_RESULT_FAIL;
  }
  else {
    max_num_entries_root = ((ulong)nodesize - 0x11) / (ulong)(long)(int)((uint)ksize + (uint)vsize);
    local_f0 = (bnode **)max_num_entries_root;
    if (meta != (btree_meta *)0x0) {
      local_f0 = (bnode **)
                 ((((ulong)nodesize - (((ulong)meta->size + 0x11 & 0xfffffffffffffff0) - 2)) - 0x13)
                 / (ulong)(long)(int)((uint)ksize + (uint)vsize));
    }
    required_size = (size_t)local_f0;
    addr._3_1_ = ksize;
    addr._4_4_ = nodesize;
    pbStack_30 = kv_ops;
    kv_ops_local = (btree_kv_ops *)blk_ops;
    blk_ops_local = (btree_blk_ops *)blk_handle;
    blk_handle_local = btree;
    if (local_f0 < num_keys) {
      max_accomm_entries = 2;
      cur_node = local_f0;
      while (cur_node = (bnode **)((long)cur_node * max_num_entries_root), cur_node < num_keys) {
        max_accomm_entries = max_accomm_entries + 1;
      }
      __s = (bid_t *)((long)&uStackY_f8 - (max_accomm_entries * 8 + 0xf & 0xfffffffffffffff0));
      puVar9 = (uint8_t *)((long)__s - (max_accomm_entries * 8 + 0xf & 0xfffffffffffffff0));
      sVar12 = max_accomm_entries << 3;
      uStackY_f8._4_4_ = 0;
      k_in_child = puVar9;
      node_bids = __s;
      puVar9[-8] = 0xf8;
      puVar9[-7] = ';';
      puVar9[-6] = '\x11';
      puVar9[-5] = '\0';
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      memset(__s,0,sVar12);
      puVar1 = k_in_child;
      __c = uStackY_f8._4_4_;
      sVar12 = max_accomm_entries << 3;
      builtin_memcpy(puVar9 + -8,"\x15<\x11",4);
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      memset(puVar1,__c,sVar12);
      uVar10 = (long)puVar9 - (ulong)(*blk_handle_local + 0xf & 0xfffffff0);
      ii_1 = uVar10;
      for (jj = 0; jj < num_keys; jj = jj + 1) {
        for (new_bid = 0; new_bid < max_accomm_entries; new_bid = new_bid + 1) {
          if (node_bids[new_bid] == 0) {
            new_addr = (void *)0x0;
            pcVar3 = (code *)**(undefined8 **)((long)blk_handle_local + 0x18);
            uVar4 = *(undefined8 *)((long)blk_handle_local + 0x10);
            *(undefined8 *)(uVar10 - 8) = 0x113caf;
            key_to_insert_1 = (void *)(*pcVar3)(uVar4,&new_addr);
            if (new_bid + 1 < max_accomm_entries) {
              *(undefined8 *)(uVar10 - 8) = 0x113cf8;
              pbVar11 = _btree_init_node(*(btree **)(uVar10 + 0x38),*(bid_t *)(uVar10 + 0x30),
                                         *(void **)(uVar10 + 0x28),*(bnode_flag_t *)(uVar10 + 0x26),
                                         *(uint16_t *)(uVar10 + 0x24),
                                         *(btree_meta **)(uVar10 + 0x18));
              node_bids[new_bid] = (bid_t)pbVar11;
            }
            else {
              *(undefined8 *)(uVar10 - 8) = 0x113d44;
              pbVar11 = _btree_init_node(*(btree **)(uVar10 + 0x38),*(bid_t *)(uVar10 + 0x30),
                                         *(void **)(uVar10 + 0x28),*(bnode_flag_t *)(uVar10 + 0x26),
                                         *(uint16_t *)(uVar10 + 0x24),
                                         *(btree_meta **)(uVar10 + 0x18));
              node_bids[new_bid] = (bid_t)pbVar11;
              *(void **)((long)blk_handle_local + 8) = new_addr;
            }
            *(void **)(k_in_child + new_bid * 8) = new_addr;
          }
          uVar8 = ii_1;
          if (new_bid == 0) {
            val_to_insert_1 = (void *)0x0;
            enc_bid = 0;
            *(undefined8 *)(uVar10 - 8) = 0x113db9;
            (*next_kv)(&val_to_insert_1,(void **)&enc_bid,aux);
            pvVar6 = val_to_insert_1;
            bVar7 = enc_bid;
            pcVar3 = *(code **)(*(long *)((long)blk_handle_local + 0x20) + 8);
            bVar5 = node_bids[new_bid];
            uVar2 = *(undefined2 *)(node_bids[new_bid] + 6);
            *(undefined8 *)(uVar10 - 8) = 0x113e00;
            (*pcVar3)(bVar5,uVar2,pvVar6,bVar7);
          }
          else {
            local_e8 = *(ulong *)(k_in_child + (new_bid - 1) * 8) >> 0x38 |
                       (*(ulong *)(k_in_child + (new_bid - 1) * 8) & 0xff000000000000) >> 0x28 |
                       (*(ulong *)(k_in_child + (new_bid - 1) * 8) & 0xff0000000000) >> 0x18 |
                       (*(ulong *)(k_in_child + (new_bid - 1) * 8) & 0xff00000000) >> 8 |
                       (*(ulong *)(k_in_child + (new_bid - 1) * 8) & 0xff000000) << 8 |
                       (*(ulong *)(k_in_child + (new_bid - 1) * 8) & 0xff0000) << 0x18 |
                       (*(ulong *)(k_in_child + (new_bid - 1) * 8) & 0xff00) << 0x28 |
                       *(long *)(k_in_child + (new_bid - 1) * 8) << 0x38;
            pcVar3 = *(code **)(*(long *)((long)blk_handle_local + 0x20) + 8);
            bVar5 = node_bids[new_bid];
            uVar2 = *(undefined2 *)(node_bids[new_bid] + 6);
            *(undefined8 *)(uVar10 - 8) = 0x113f7f;
            (*pcVar3)(bVar5,uVar2,uVar8,&local_e8);
          }
          uVar8 = ii_1;
          *(short *)(node_bids[new_bid] + 6) = *(short *)(node_bids[new_bid] + 6) + 1;
          if (*(short *)(node_bids[new_bid] + 6) != 1) {
            if (max_num_entries_root <= *(ushort *)(node_bids[new_bid] + 6)) {
              pvVar6 = *(void **)((long)blk_handle_local + 0x10);
              bVar5 = *(bid_t *)(k_in_child + new_bid * 8);
              *(undefined8 *)(uVar10 - 8) = 0x114024;
              (*write_done)(pvVar6,bVar5,aux);
              node_bids[new_bid] = 0;
              puVar1 = k_in_child + new_bid * 8;
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              puVar1[4] = '\0';
              puVar1[5] = '\0';
              puVar1[6] = '\0';
              puVar1[7] = '\0';
            }
            break;
          }
          pcVar3 = (code *)**(undefined8 **)((long)blk_handle_local + 0x20);
          bVar5 = node_bids[new_bid];
          *(undefined8 *)(uVar10 - 8) = 0x113fe2;
          (*pcVar3)(bVar5,0,uVar8,0);
        }
      }
      btree_local._4_4_ = BTREE_RESULT_SUCCESS;
    }
    else {
      subblock_size = max_num_entries_non_root + num_keys * (long)(int)((uint)ksize + (uint)vsize);
      if ((btree->blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
         (btree->blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0))
      {
        auStackY_100[0] = 0x8f;
        auStackY_100[1] = ':';
        auStackY_100[2] = '\x11';
        auStackY_100[3] = '\0';
        auStackY_100[4] = '\0';
        auStackY_100[5] = '\0';
        auStackY_100[6] = '\0';
        auStackY_100[7] = '\0';
        min_nodesize = (size_t)(*btree->blk_ops->blk_alloc)(btree->blk_handle,&btree->root_bid);
      }
      else {
        builtin_memcpy(auStackY_100,"\x12:\x11",4);
        auStackY_100[4] = '\0';
        auStackY_100[5] = '\0';
        auStackY_100[6] = '\0';
        auStackY_100[7] = '\0';
        min_nodesize = (size_t)(*btree->blk_ops->blk_alloc_sub)(btree->blk_handle,&btree->root_bid);
        builtin_memcpy(auStackY_100,"4:\x11",4);
        auStackY_100[4] = '\0';
        auStackY_100[5] = '\0';
        auStackY_100[6] = '\0';
        auStackY_100[7] = '\0';
        root_node = (bnode *)(**(code **)(*(long *)((long)blk_handle_local + 0x18) + 0x38))
                                       (*(undefined8 *)((long)blk_handle_local + 0x10),
                                        *(undefined8 *)((long)blk_handle_local + 8));
        if (root_node < subblock_size) {
          builtin_memcpy(auStackY_100,"l:\x11",4);
          auStackY_100[4] = '\0';
          auStackY_100[5] = '\0';
          auStackY_100[6] = '\0';
          auStackY_100[7] = '\0';
          min_nodesize = (**(code **)(*(long *)((long)blk_handle_local + 0x18) + 0x10))
                                   (*(undefined8 *)((long)blk_handle_local + 0x10),
                                    *(undefined8 *)((long)blk_handle_local + 8),subblock_size,
                                    (long)blk_handle_local + 8);
        }
      }
      auStackY_100[0] = 0xbd;
      auStackY_100[1] = ':';
      auStackY_100[2] = '\x11';
      auStackY_100[3] = '\0';
      auStackY_100[4] = '\0';
      auStackY_100[5] = '\0';
      auStackY_100[6] = '\0';
      auStackY_100[7] = '\0';
      ii = (uint64_t)
           _btree_init_node((btree *)new_bid,(bid_t)new_addr,key_to_insert_1,val_to_insert_1._6_2_,
                            val_to_insert_1._4_2_,(btree_meta *)enc_bid);
      for (key_to_insert = (void *)0x0; key_to_insert < num_keys;
          key_to_insert = (void *)((long)key_to_insert + 1)) {
        val_to_insert = (void *)0x0;
        exp_height = 0;
        auStackY_100[0] = 0xf5;
        auStackY_100[1] = ':';
        auStackY_100[2] = '\x11';
        auStackY_100[3] = '\0';
        auStackY_100[4] = '\0';
        auStackY_100[5] = '\0';
        auStackY_100[6] = '\0';
        auStackY_100[7] = '\0';
        (*next_kv)(&val_to_insert,(void **)&exp_height,aux);
        builtin_memcpy(auStackY_100,"\x1a;\x11",4);
        auStackY_100[4] = '\0';
        auStackY_100[5] = '\0';
        auStackY_100[6] = '\0';
        auStackY_100[7] = '\0';
        (**(code **)(*(long *)((long)blk_handle_local + 0x20) + 8))
                  (ii,*(undefined2 *)(ii + 6),val_to_insert,exp_height);
        *(short *)(ii + 6) = *(short *)(ii + 6) + 1;
      }
      btree_local._4_4_ = BTREE_RESULT_SUCCESS;
    }
  }
  return btree_local._4_4_;
}

Assistant:

btree_result btree_init_and_load(
        struct btree *btree,
        void *blk_handle,
        struct btree_blk_ops *blk_ops,
        struct btree_kv_ops *kv_ops,
        uint32_t nodesize,
        uint8_t ksize,
        uint8_t vsize,
        bnode_flag_t flag,
        struct btree_meta *meta,
        uint64_t num_keys,
        btree_load_get_next_kv* next_kv,
        btree_load_write_done* write_done,
        void* aux)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // Calculate max # key-values per node.
    size_t max_num_entries_non_root =
        (nodesize - sizeof(struct bnode) - BLK_MARKER_SIZE) / (ksize + vsize);
    size_t max_num_entries_root =
        meta
        ? ( nodesize - sizeof(struct bnode) - _metasize_align(meta->size) -
            sizeof(metasize_t) - BLK_MARKER_SIZE ) / (ksize + vsize)
        : max_num_entries_non_root;

    if (num_keys <= max_num_entries_root) {
        // Single height tree.
        size_t required_size = min_nodesize + num_keys * (ksize + vsize);
        if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
            addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);

            size_t subblock_size =
                btree->blk_ops->blk_get_size(btree->blk_handle,
                                             btree->root_bid);
            if (subblock_size < required_size) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        required_size,
                                                        &btree->root_bid);
            }
        } else {
            addr = btree->blk_ops->blk_alloc(btree->blk_handle, &btree->root_bid);
        }
        struct bnode* root_node =
            _btree_init_node( btree, btree->root_bid, addr,
                              btree->root_flag, 1, meta );

        // Put entries.
        for (uint64_t ii = 0; ii < num_keys; ++ii) {
            void* key_to_insert = nullptr;
            void* val_to_insert = nullptr;
            next_kv(&key_to_insert, &val_to_insert, aux);
            btree->kv_ops->set_kv( root_node, root_node->nentry,
                                   key_to_insert, val_to_insert );
            root_node->nentry++;
        }
        return BTREE_RESULT_SUCCESS;

    }

    // Otherwise: height >= 2, calculate the tree height.
    size_t exp_height = 2;
    uint64_t max_accomm_entries = max_num_entries_root * max_num_entries_non_root;
    while (max_accomm_entries < num_keys) {
        exp_height++;
        max_accomm_entries *= max_num_entries_non_root;
    }

    struct bnode** cur_node = alca(struct bnode*, exp_height);
    bid_t* node_bids = alca(bid_t, exp_height);
    memset(cur_node, 0x0, sizeof(struct bnode*) * exp_height);
    memset(node_bids, 0x0, sizeof(bid_t) * exp_height);

    uint8_t *k_in_child = alca(uint8_t, btree->ksize);

    for (uint64_t ii = 0; ii < num_keys; ++ii) {
        for (size_t jj = 0; jj < exp_height; ++jj) {
            if (!cur_node[jj]) {
                bid_t new_bid = 0;
                void* new_addr = btree->blk_ops->blk_alloc( btree->blk_handle,
                                                            &new_bid );
                if (jj + 1 < exp_height) {
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     0x0, jj + 1, NULL );
                } else {
                    // Root node, should set the flags.
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     btree->root_flag, jj + 1,
                                                     meta );
                    btree->root_bid = new_bid;
                }
                node_bids[jj] = new_bid;
            }

            if (jj == 0) {
                // Leaf node: {key, value}
                void* key_to_insert = nullptr;
                void* val_to_insert = nullptr;
                next_kv(&key_to_insert, &val_to_insert, aux);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       key_to_insert, val_to_insert );
            } else {
                // Non-leaf node: {key, BID of child}
                bid_t enc_bid = _endian_encode(node_bids[jj - 1]);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       k_in_child, &enc_bid );
            }

            cur_node[jj]->nentry++;
            if (cur_node[jj]->nentry == 1) {
                // Need to put the first entry to the parent node.
                btree->kv_ops->get_kv(cur_node[jj], 0, k_in_child, NULL);
            } else {
                if (cur_node[jj]->nentry >= max_num_entries_non_root) {
                    // Otherwise: full, should allocate a new one.
                    write_done(btree->blk_handle, node_bids[jj], aux);
                    cur_node[jj] = NULL;
                    node_bids[jj] = 0;
                }
                break;
            }
        }
    }

    return BTREE_RESULT_SUCCESS;
}